

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Experiment.cpp
# Opt level: O2

double __thiscall Experiment::exp(Experiment *this,double __x)

{
  clock_t cVar1;
  clock_t cVar2;
  clock_t cVar3;
  clock_t cVar4;
  clock_t cVar5;
  ostream *poVar6;
  ostream *in_RCX;
  short in_DX;
  uint uVar7;
  ushort in_SI;
  ushort k;
  int iVar8;
  bool bVar9;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  int local_218;
  int local_214;
  karatsubaMultiplication kara;
  divideAndConquer dac;
  gradeSchoolMultiplication gsm;
  int local_1e0;
  int local_1d8;
  Num n1_1;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  avr_t_kara;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  avr_t_dc;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  avr_t_sch;
  Num local_148;
  Num n2_1;
  Num n5;
  Num n4;
  Num n3;
  Num n2;
  Num n1;
  
  Num::Num(&n1);
  Num::Num(&n2);
  Num::Num(&n3);
  Num::Num(&n4);
  Num::Num(&n5);
  gradeSchoolMultiplication::gradeSchoolMultiplication(&gsm);
  divideAndConquer::divideAndConquer(&dac);
  karatsubaMultiplication::karatsubaMultiplication(&kara);
  avr_t_sch.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  avr_t_dc.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  avr_t_sch.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  avr_t_sch.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  avr_t_dc.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  avr_t_dc.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  avr_t_kara.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  avr_t_kara.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  avr_t_kara.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (k = 0; k < in_SI; k = k + in_DX) {
    iVar8 = 0;
    uVar7 = (uint)k;
    local_1e0 = 3;
    local_218 = 0;
    local_214 = 0;
    while( true ) {
      bVar9 = local_1e0 == 0;
      local_1e0 = local_1e0 + -1;
      if (bVar9) break;
      Num::createNumber(&n1_1,&n1_1,k);
      Num::createNumber(&n2_1,&n2_1,k);
      cVar1 = clock();
      gradeSchoolMultiplication::multiply(&local_148,&gsm,&n1_1,&n2_1);
      Num::operator=(&n3,&local_148);
      Num::~Num(&local_148);
      cVar2 = clock();
      cVar3 = clock();
      divideAndConquer::multiply(&local_148,&dac,&n1_1,&n2_1);
      Num::operator=(&n4,&local_148);
      Num::~Num(&local_148);
      cVar4 = clock();
      cVar5 = clock();
      karatsubaMultiplication::multiply(&local_148,&kara,&n1_1,&n2_1);
      Num::operator=(&n5,&local_148);
      local_1d8 = (int)cVar1;
      local_214 = (local_214 - local_1d8) + (int)cVar2;
      local_218 = (local_218 - (int)cVar3) + (int)cVar4;
      Num::~Num(&local_148);
      cVar1 = clock();
      iVar8 = (iVar8 - (int)cVar5) + (int)cVar1;
      Num::~Num(&n2_1);
      Num::~Num(&n1_1);
    }
    n1_1._0_4_ = uVar7;
    n1_1._4_4_ = local_214 / 3;
    std::
    vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
    ::emplace_back<std::pair<unsigned_int,unsigned_int>>
              ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
                *)&avr_t_sch,(pair<unsigned_int,_unsigned_int> *)&n1_1);
    n1_1._0_4_ = uVar7;
    n1_1._4_4_ = local_218 / 3;
    std::
    vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
    ::emplace_back<std::pair<unsigned_int,unsigned_int>>
              ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
                *)&avr_t_dc,(pair<unsigned_int,_unsigned_int> *)&n1_1);
    n1_1._0_4_ = uVar7;
    n1_1._4_4_ = iVar8 / 3;
    std::
    vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
    ::emplace_back<std::pair<unsigned_int,unsigned_int>>
              ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
                *)&avr_t_kara,(pair<unsigned_int,_unsigned_int> *)&n1_1);
    poVar6 = (ostream *)std::ostream::operator<<(in_RCX,k);
    poVar6 = std::operator<<(poVar6,", ");
    std::ostream::operator<<(poVar6,local_214 / 3);
    poVar6 = std::operator<<(in_RCX,", ");
    std::ostream::operator<<(poVar6,local_218 / 3);
    poVar6 = std::operator<<(in_RCX,", ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar8 / 3);
    std::operator<<(poVar6,"\n");
  }
  std::
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Vector_base(&avr_t_kara.
                   super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 );
  std::
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Vector_base(&avr_t_dc.
                   super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 );
  std::
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Vector_base(&avr_t_sch.
                   super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 );
  karatsubaMultiplication::~karatsubaMultiplication(&kara);
  divideAndConquer::~divideAndConquer(&dac);
  gradeSchoolMultiplication::~gradeSchoolMultiplication(&gsm);
  Num::~Num(&n5);
  Num::~Num(&n4);
  Num::~Num(&n3);
  Num::~Num(&n2);
  Num::~Num(&n1);
  return (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
}

Assistant:

void Experiment::exp(Num::Short k, Num::Short step, std::ofstream& out)
{

    Num n1, n2,n3,n4,n5;

    gradeSchoolMultiplication gsm;
    divideAndConquer dac;
    karatsubaMultiplication kara;



    int avg_t_sch, avg_t_dc, avg_t_kara;

    std::vector  <std::pair<unsigned int,unsigned int>> avr_t_sch;
    std::vector  <std::pair<unsigned int, unsigned int>> avr_t_dc;
    std::vector  <std::pair<unsigned int, unsigned int>> avr_t_kara;


    for (Num::Short i = 0; i < k; i+=step)
    {
        avg_t_sch = 0;
        avg_t_dc = 0;
        avg_t_kara = 0;


            for (int j = 0; j <3; j++)
            {
                Num n1 = n1.createNumber(i);
                Num n2 = n2.createNumber(i);

                unsigned int start_time_sch =  clock();
                n3 = gsm.multiply(n1, n2);
                unsigned int end_time_sch = clock(); // finish time
                unsigned int search_time_sch = end_time_sch - start_time_sch; // overall time
                avg_t_sch += search_time_sch;

                unsigned int start_time_dc =  clock();
                n4 = dac.multiply(n1, n2);
                unsigned int end_time_dc = clock(); // finish time
                unsigned int search_time_dc = end_time_dc - start_time_dc; // overall time
                avg_t_dc += search_time_dc;

                unsigned int start_time_kara =  clock();
                n5 = kara.multiply(n1, n2);
                unsigned int end_time_kara = clock(); // finish time
                unsigned int search_time_kara = end_time_kara - start_time_kara; // overall time
                avg_t_kara += search_time_kara;
            }



        avr_t_sch.push_back(std::make_pair(i, avg_t_sch/3));
        avr_t_dc.push_back(std::make_pair(i, avg_t_dc/3));
        avr_t_kara.push_back(std::make_pair(i, avg_t_kara/3));

        out << i << ", " << avg_t_sch/3;
        out  << ", " << avg_t_dc/3;
        out << ", " << avg_t_kara/3<< "\n";
    }

}